

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

void __thiscall Generator::addClassInfos(Generator *this)

{
  long lVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  ClassInfoDef *pCVar4;
  ClassInfoDef *c;
  ClassInfoDef *u;
  
  lVar1 = (this->cdef->super_BaseDef).classInfoList.d.size;
  if (lVar1 != 0) {
    u = (this->cdef->super_BaseDef).classInfoList.d.ptr;
    pCVar4 = u + lVar1;
    do {
      __stream = (FILE *)this->out;
      uVar2 = QtPrivate::indexOf<QByteArray,QByteArray>(&this->strings,&u->name,0);
      uVar3 = QtPrivate::indexOf<QByteArray,QByteArray>(&this->strings,&u->value,0);
      fprintf(__stream,"            { %4d, %4d },\n",uVar2 & 0xffffffff,uVar3 & 0xffffffff);
      u = u + 1;
    } while (u != pCVar4);
  }
  return;
}

Assistant:

void Generator::addClassInfos()
{
    for (const ClassInfoDef &c : std::as_const(cdef->classInfoList))
        fprintf(out, "            { %4d, %4d },\n", stridx(c.name), stridx(c.value));
}